

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

long contained_cost(obj *obj,monst *shkp,long price,boolean usell,boolean unpaid_only)

{
  boolean bVar1;
  long lVar2;
  obj *local_30;
  obj *otmp;
  boolean unpaid_only_local;
  long lStack_20;
  boolean usell_local;
  long price_local;
  monst *shkp_local;
  obj *obj_local;
  
  lStack_20 = price;
  for (local_30 = obj->cobj; local_30 != (obj *)0x0; local_30 = local_30->nobj) {
    if (local_30->oclass != '\f') {
      if (usell == '\0') {
        if (((*(uint *)&local_30->field_0x4a >> 3 & 1) == 0) &&
           ((unpaid_only == '\0' ||
            ((unpaid_only != '\0' && ((*(uint *)&local_30->field_0x4a >> 2 & 1) != 0)))))) {
          lVar2 = get_cost(local_30,shkp);
          lStack_20 = lVar2 * local_30->quan + lStack_20;
        }
      }
      else {
        bVar1 = saleable(shkp,local_30);
        if (((((bVar1 != '\0') && ((*(uint *)&local_30->field_0x4a >> 2 & 1) == 0)) &&
             (local_30->oclass != '\x0f')) &&
            ((local_30->oclass != '\a' || (local_30->oeaten == 0)))) &&
           (((local_30->otyp != 0xe5 && (local_30->otyp != 0xe6)) ||
            (SBORROW8((long)local_30->age,(long)objects[local_30->otyp].oc_cost * 0x14) ==
             (long)local_30->age + (long)objects[local_30->otyp].oc_cost * -0x14 < 0)))) {
          lVar2 = set_cost(local_30,shkp);
          lStack_20 = lVar2 + lStack_20;
        }
      }
      if (local_30->cobj != (obj *)0x0) {
        lVar2 = contained_cost(local_30,shkp,lStack_20,usell,unpaid_only);
        lStack_20 = lVar2 + lStack_20;
      }
    }
  }
  return lStack_20;
}

Assistant:

long contained_cost(const struct obj *obj, struct monst *shkp, long price,
		    boolean usell, boolean unpaid_only)
{
	struct obj *otmp;

	/* the price of contained objects */
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
	    if (otmp->oclass == COIN_CLASS) continue;
	    /* the "top" container is evaluated by caller */
	    if (usell) {
		if (saleable(shkp, otmp) &&
			!otmp->unpaid && otmp->oclass != BALL_CLASS &&
			!(otmp->oclass == FOOD_CLASS && otmp->oeaten) &&
			!(Is_candle(otmp) && otmp->age <
				20L * (long)objects[otmp->otyp].oc_cost))
		    price += set_cost(otmp, shkp);
	    } else if (!otmp->no_charge &&
		      (!unpaid_only || (unpaid_only && otmp->unpaid))) {
		    price += get_cost(otmp, shkp) * otmp->quan;
	    }

	    if (Has_contents(otmp))
		    price += contained_cost(otmp, shkp, price, usell, unpaid_only);
	}

	return price;
}